

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Value *pVVar1;
  Value *extraout_RAX;
  undefined4 in_register_00000034;
  string local_40;
  
  pVVar1 = Scope::lookup((this->scope_)._M_t.
                         super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                         .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                         _M_head_impl,*(Symbol **)(CONCAT44(in_register_00000034,__fd) + 0x40));
  if (pVVar1 == (Value *)0x0) {
    this->result_ = (Value *)0x0;
    pVVar1 = (Value *)0x0;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    pVVar1 = IRBuilder::createLoad(&this->super_IRBuilder,pVVar1,&local_40);
    this->result_ = pVVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pVVar1 = extraout_RAX;
    }
  }
  return (int)pVVar1;
}

Assistant:

void IRGenerator::accept(VariableExpr& expr) {
  // loads the value of the given variable

  if (auto var = scope().lookup(expr.variable())) {
    result_ = createLoad(var);
  } else {
    result_ = nullptr;
  }
}